

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseRequirement(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  ParseState copy;
  
  iVar7 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar7 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar7) {
    bVar8 = false;
    goto LAB_001055d4;
  }
  uVar3 = (state->parse_state).mangled_idx;
  uVar4 = (state->parse_state).out_cur_idx;
  uVar5 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar6 = ParseOneCharToken(state,'X');
  if (bVar6) {
    bVar6 = ParseExpression(state);
    if (!bVar6) goto LAB_00105575;
    ParseOneCharToken(state,'N');
    bVar6 = ParseOneCharToken(state,'R');
    bVar8 = true;
    if (bVar6) {
      bVar6 = ParseName(state);
      if (!bVar6) goto LAB_00105575;
    }
  }
  else {
LAB_00105575:
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseOneCharToken(state,'T');
    if (bVar6) {
      bVar6 = ParseType(state);
      bVar8 = true;
      if (bVar6) goto LAB_001055cf;
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar6 = ParseOneCharToken(state,'Q');
    if (bVar6) {
      bVar6 = ParseExpression(state);
      bVar8 = true;
      if (bVar6) goto LAB_001055cf;
    }
    pPVar1->mangled_idx = uVar3;
    pPVar1->out_cur_idx = uVar4;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar5;
    bVar8 = false;
  }
LAB_001055cf:
  iVar7 = state->recursion_depth + -1;
LAB_001055d4:
  state->recursion_depth = iVar7;
  return bVar8;
}

Assistant:

static bool ParseRequirement(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  ParseState copy = state->parse_state;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      Optional(ParseOneCharToken(state, 'N')) &&
      // This logic backtracks cleanly if we eat an R but a valid type doesn't
      // follow it.
      (!ParseOneCharToken(state, 'R') || ParseTypeConstraint(state))) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'T') && ParseType(state)) return true;
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'Q') && ParseExpression(state)) return true;
  state->parse_state = copy;

  return false;
}